

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathway.c
# Opt level: O2

pathway_directions_t parse_pathway_directions(char *value)

{
  pathway_directions_t pVar1;
  pathway_directions_t pVar2;
  
  if (*value == '0') {
    pVar2 = PD_UNIDIRECTIONAL;
  }
  else {
    if (*value != '1') {
      return PD_NOT_SET;
    }
    pVar2 = PD_BIDIRECTIONAL;
  }
  pVar1 = PD_NOT_SET;
  if (value[1] == '\0') {
    pVar1 = pVar2;
  }
  return pVar1;
}

Assistant:

pathway_directions_t parse_pathway_directions(const char *value) {
    if (strcmp(value, "0") == 0)
        return PD_UNIDIRECTIONAL;
    else if (strcmp(value, "1") == 0)
        return PD_BIDIRECTIONAL;
    else
        return PD_NOT_SET;
}